

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidgettextcontrol.cpp
# Opt level: O0

void __thiscall QWidgetTextControlPrivate::setClipboardSelection(QWidgetTextControlPrivate *this)

{
  Mode MVar1;
  QMimeData *pQVar2;
  ulong uVar3;
  QWidgetTextControl *pQVar4;
  QWidgetTextControlPrivate *in_RDI;
  QMimeData *data;
  QWidgetTextControl *q;
  QClipboard *clipboard;
  
  pQVar2 = (QMimeData *)QGuiApplication::clipboard();
  uVar3 = QTextCursor::hasSelection();
  if (((uVar3 & 1) != 0) && (uVar3 = QClipboard::supportsSelection(), (uVar3 & 1) != 0)) {
    pQVar4 = q_func(in_RDI);
    MVar1 = (**(code **)(*(long *)pQVar4 + 0x98))();
    QClipboard::setMimeData(pQVar2,MVar1);
  }
  return;
}

Assistant:

void QWidgetTextControlPrivate::setClipboardSelection()
{
    QClipboard *clipboard = QGuiApplication::clipboard();
    if (!cursor.hasSelection() || !clipboard->supportsSelection())
        return;
    Q_Q(QWidgetTextControl);
    QMimeData *data = q->createMimeDataFromSelection();
    clipboard->setMimeData(data, QClipboard::Selection);
}